

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  undefined8 unaff_RBP;
  undefined7 uVar3;
  ulong uVar2;
  undefined4 in_register_00000034;
  undefined1 *puVar4;
  uv_buf_t buf;
  undefined1 local_30 [8];
  long local_28;
  
  local_28 = BIO_ctrl((BIO *)CONCAT44(in_register_00000034,__fd),3,0,local_30);
  uVar3 = (undefined7)((ulong)unaff_RBP >> 8);
  if (local_28 == 0) {
    uVar2 = CONCAT71(uVar3,1);
    goto LAB_00149c46;
  }
  if ((this->super_BaseClient).m_state == ConnectedState) {
    iVar1 = uv_is_writable(this->m_stream);
    if (iVar1 == 0) goto LAB_00149c2e;
    puVar4 = local_30;
    iVar1 = uv_try_write(this->m_stream,puVar4,1);
    uVar2 = CONCAT71(uVar3,0 < iVar1);
    if (iVar1 < 1) {
      close(this,(int)puVar4);
      goto LAB_00149c2e;
    }
  }
  else {
LAB_00149c2e:
    uVar2 = 0;
  }
  BIO_ctrl((BIO *)CONCAT44(in_register_00000034,__fd),1,0,(void *)0x0);
LAB_00149c46:
  return uVar2 & 0xffffffff;
}

Assistant:

bool xmrig::Client::send(BIO *bio)
{
#   ifdef XMRIG_FEATURE_TLS
    uv_buf_t buf;
    buf.len = BIO_get_mem_data(bio, &buf.base);

    if (buf.len == 0) {
        return true;
    }

    LOG_DEBUG("[%s] TLS send     (%d bytes)", url(), static_cast<int>(buf.len));

    bool result = false;
    if (state() == ConnectedState && uv_is_writable(m_stream)) {
        result = uv_try_write(m_stream, &buf, 1) > 0;

        if (!result) {
            close();
        }
    }
    else {
        LOG_DEBUG_ERR("[%s] send failed, invalid state: %d", url(), m_state);
    }

    (void) BIO_reset(bio);

    return result;
#   else
    return false;
#   endif
}